

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_to_dfa.cpp
# Opt level: O2

SyntaxTreeNode * __thiscall
RegexToDFAConverter::factor_eval(RegexToDFAConverter *this,string *expr,int *curr_pos)

{
  char ch;
  size_type sVar1;
  bool bVar2;
  SyntaxTreeNode *this_00;
  SyntaxTreeNode *pSVar3;
  pointer pcVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  __node_base *p_Var8;
  uint uVar9;
  __node_base *p_Var10;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  SyntaxTreeNode *son;
  string *local_48;
  SyntaxTreeNode *local_40;
  uint *local_38;
  
  this_00 = (SyntaxTreeNode *)operator_new(0x90);
  pSVar3 = this_00;
  SyntaxTreeNode::SyntaxTreeNode(this_00);
  ch = (expr->_M_dataplus)._M_p[*curr_pos];
  if (ch == '$') {
    this_00->nullable = true;
  }
  else if (ch == '(') {
    *curr_pos = *curr_pos + 1;
    pSVar3 = expression_eval(this,expr,curr_pos);
    son = pSVar3;
    std::
    _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::operator=(&(this_00->first_pos)._M_h,&(pSVar3->first_pos)._M_h);
    std::
    _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::operator=(&(this_00->last_pos)._M_h,&(pSVar3->last_pos)._M_h);
    std::
    vector<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
    ::push_back((vector<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
                 *)this_00,&son);
    this_00->nullable = son->nullable;
    SyntaxTreeNode::wipe_sons(this_00);
  }
  else {
    bVar2 = is_letter((RegexToDFAConverter *)pSVar3,ch);
    if ((bVar2) || (iVar7 = *curr_pos, (expr->_M_dataplus)._M_p[iVar7] == '#')) {
      iVar7 = this->leaves_count_;
      this->leaves_count_ = iVar7 + 1;
      std::
      vector<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::allocator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>_>
      ::resize(&this->follow_pos_,(long)iVar7 + 2);
      std::vector<char,_std::allocator<char>_>::resize
                (&this->what_letter_,(long)this->leaves_count_ + 1);
      this_00->nullable = false;
      son = (SyntaxTreeNode *)CONCAT44(son._4_4_,this->leaves_count_);
      __l._M_len = 1;
      __l._M_array = (iterator)&son;
      std::
      _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::operator=(&(this_00->first_pos)._M_h,__l);
      son = (SyntaxTreeNode *)CONCAT44(son._4_4_,this->leaves_count_);
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&son;
      std::
      _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::operator=(&(this_00->last_pos)._M_h,__l_00);
      iVar7 = this->leaves_count_;
      this_00->leaf_index = iVar7;
      (this->what_letter_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start[iVar7] = (expr->_M_dataplus)._M_p[*curr_pos];
    }
    else {
      this_00->nullable = true;
      *curr_pos = iVar7 + -1;
    }
  }
  uVar5 = (long)*curr_pos + 1;
  *curr_pos = (int)uVar5;
  pcVar4 = (expr->_M_dataplus)._M_p;
  iVar7 = (int)expr->_M_string_length;
  local_40 = this_00;
  if (((int)uVar5 < iVar7) && (pcVar4[uVar5] == '*')) {
    this_00->nullable = true;
    p_Var8 = &(this_00->last_pos)._M_h._M_before_begin;
    local_48 = expr;
    local_38 = (uint *)curr_pos;
    while (p_Var8 = p_Var8->_M_nxt, p_Var8 != (__node_base *)0x0) {
      sVar1 = *(size_type *)(p_Var8 + 1);
      p_Var10 = &(this_00->first_pos)._M_h._M_before_begin;
      while (p_Var10 = p_Var10->_M_nxt, p_Var10 != (__node_base *)0x0) {
        son = (SyntaxTreeNode *)CONCAT44(son._4_4_,(int)*(size_type *)(p_Var10 + 1));
        std::__detail::
        _Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert((_Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)((this->follow_pos_).
                     super__Vector_base<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::allocator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (int)sVar1),(value_type *)&son);
      }
    }
    pcVar4 = (local_48->_M_dataplus)._M_p;
    iVar7 = (int)local_48->_M_string_length;
    uVar5 = (ulong)*local_38;
    curr_pos = (int *)local_38;
  }
  uVar9 = (uint)uVar5;
  for (lVar6 = (long)(int)uVar9; (uVar9 = uVar9 + 1, lVar6 < iVar7 && (pcVar4[lVar6] == '*'));
      lVar6 = lVar6 + 1) {
    *curr_pos = uVar9;
  }
  return local_40;
}

Assistant:

RegexToDFAConverter::SyntaxTreeNode* RegexToDFAConverter::factor_eval(
    const string &expr, int &curr_pos) {

  SyntaxTreeNode* root = new SyntaxTreeNode;
  if (expr[curr_pos] == '(') {
    curr_pos++;
    auto son = expression_eval(expr, curr_pos);
    root->first_pos = son->first_pos;
    root->last_pos = son->last_pos;
    root->sons.push_back(son);
    root->nullable = son->nullable;
    root->wipe_sons();
  }
  else {
    if (expr[curr_pos] == kLambda)
      root->nullable = true;
    else if (!is_letter(expr[curr_pos]) && expr[curr_pos] != '#')
      root->nullable = true, --curr_pos;
    else {
      ++leaves_count_;
      follow_pos_.resize((size_t)leaves_count_ + 1);
      what_letter_.resize((size_t)leaves_count_ + 1);
      root->nullable = false;
      root->first_pos = {leaves_count_};
      root->last_pos = {leaves_count_};
      root->leaf_index = leaves_count_;
      what_letter_[leaves_count_] = expr[curr_pos];
    }
  }

  if (++curr_pos < (int)expr.size() && expr[curr_pos] == '*') {
    root->nullable = true;
    for (int first : root->last_pos)
      for (int second : root->first_pos)
        follow_pos_[first].insert(second);
  }
  while (curr_pos < (int)expr.size() && expr[curr_pos] == '*')
    curr_pos++;
  return root;
}